

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O2

ares_bool_t read_cmdline(int argc,char **argv,int start_idx)

{
  char cVar1;
  char cVar2;
  ulong *puVar3;
  char *pcVar4;
  int iVar5;
  ares_bool_t aVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  dig_opt_cb_t *pp_Var10;
  char *pcVar11;
  bool bVar12;
  char **str;
  
  do {
    pp_Var10 = &dig_options[0].cb;
    if (argc <= start_idx) {
      return ARES_TRUE;
    }
    bVar12 = false;
    while (!bVar12) {
      puVar3 = (ulong *)pp_Var10[-1];
      if ((puVar3 == (ulong *)0x0) && (*pp_Var10 == (dig_opt_cb_t)0x0)) {
        snprintf(global_config.error,0x100,"unrecognized option %s",argv[start_idx]);
        return ARES_FALSE;
      }
      cVar1 = ((anon_struct_40_6_0ff30dc8 *)(pp_Var10 + -4))->prefix;
      if (((int)cVar1 == 0) || (cVar1 == *argv[start_idx])) {
        pcVar11 = argv[start_idx] + (cVar1 != '\0');
        iVar5 = ares_streq_max(pcVar11,"no",2);
        bVar12 = iVar5 == 0;
        pcVar11 = pcVar11 + (ulong)!bVar12 * 2;
        cVar2 = *(char *)(pp_Var10 + -2);
        if ((cVar2 == '\0') || (pcVar7 = strchr(pcVar11,(int)cVar2), pcVar7 == (char *)0x0)) {
          lVar9 = ares_strlen(pcVar11);
          pcVar7 = (char *)0x0;
        }
        else {
          lVar9 = (long)pcVar7 - (long)pcVar11;
          pcVar7 = pcVar7 + 1;
        }
        pcVar4 = (char *)pp_Var10[-3];
        if ((pcVar4 == (char *)0x0) || (iVar5 = ares_streq_max(pcVar11,pcVar4,lVar9), iVar5 != 0)) {
          if (*(opt_type_t *)((long)pp_Var10 + -0xc) == OPT_TYPE_BOOL) {
            if (puVar3 == (ulong *)0x0) {
              pcVar11 = "invalid use for %c%s";
              goto LAB_0010410e;
            }
            *(uint *)puVar3 = (uint)bVar12;
            bVar12 = true;
          }
          else {
            if (pcVar4 == (char *)0x0) {
              pcVar7 = pcVar11;
            }
            if (cVar1 != '\0' && cVar2 == '\0') {
              if (start_idx == argc + -1) {
                pcVar11 = "insufficient arguments for %c%s";
                goto LAB_0010410e;
              }
              pcVar7 = argv[(long)start_idx + 1];
              start_idx = start_idx + 1;
            }
            switch(*(opt_type_t *)((long)pp_Var10 + -0xc)) {
            case OPT_TYPE_STRING:
              if (puVar3 == (ulong *)0x0) {
LAB_001040d7:
                pcVar11 = "invalid use for %c%s";
LAB_0010410e:
                snprintf(global_config.error,0x100,pcVar11,(ulong)(uint)(int)cVar1,pcVar4);
                return ARES_FALSE;
              }
              if (pcVar7 == (char *)0x0) {
LAB_001040e7:
                pcVar11 = "missing value for %c%s";
                goto LAB_0010410e;
              }
              free((void *)*puVar3);
              pcVar11 = strdup(pcVar7);
              *puVar3 = (ulong)pcVar11;
              break;
            case OPT_TYPE_SIZE_T:
              if (puVar3 == (ulong *)0x0) goto LAB_001040d7;
              if (pcVar7 == (char *)0x0) goto LAB_001040e7;
              iVar5 = ares_str_isnum(pcVar7);
              if (iVar5 == 0) {
LAB_00104126:
                pcVar11 = "%c%s is not a numeric value";
                goto LAB_0010410e;
              }
              uVar8 = strtoul(pcVar7,(char **)0x0,10);
              *puVar3 = uVar8;
              break;
            case OPT_TYPE_U16:
              if (puVar3 == (ulong *)0x0) goto LAB_001040d7;
              if (pcVar7 == (char *)0x0) goto LAB_001040e7;
              iVar5 = ares_str_isnum(pcVar7);
              if (iVar5 == 0) goto LAB_00104126;
              uVar8 = strtoul(pcVar7,(char **)0x0,10);
              *(short *)puVar3 = (short)uVar8;
              break;
            case OPT_TYPE_FUNC:
              if (*pp_Var10 == (dig_opt_cb_t)0x0) {
                builtin_strncpy(global_config.error,"missing callback",0x11);
                return ARES_FALSE;
              }
              aVar6 = (**pp_Var10)(cVar1,pcVar4,SUB14(bVar12,0),pcVar7);
              bVar12 = true;
              if (aVar6 == ARES_FALSE) {
                return ARES_FALSE;
              }
              goto LAB_00104076;
            }
            bVar12 = true;
          }
        }
        else {
          bVar12 = false;
        }
      }
      else {
        bVar12 = false;
      }
LAB_00104076:
      pp_Var10 = pp_Var10 + 5;
    }
    start_idx = start_idx + 1;
  } while( true );
}

Assistant:

static ares_bool_t read_cmdline(int argc, const char * const *argv,
                                int start_idx)
{
  int    arg;
  size_t opt;

  for (arg = start_idx; arg < argc; arg++) {
    ares_bool_t option_handled = ARES_FALSE;

    for (opt = 0; !option_handled &&
                  (dig_options[opt].opt != NULL || dig_options[opt].cb != NULL);
         opt++) {
      ares_bool_t is_true = ARES_TRUE;
      const char *value   = NULL;
      const char *nameptr = NULL;
      size_t      namelen;

      /* Match prefix character */
      if (dig_options[opt].prefix != 0 &&
          dig_options[opt].prefix != *(argv[arg])) {
        continue;
      }

      nameptr = argv[arg];

      /* skip prefix */
      if (dig_options[opt].prefix != 0) {
        nameptr++;
      }

      /* Negated option if it has a 'no' prefix */
      if (ares_streq_max(nameptr, "no", 2)) {
        is_true  = ARES_FALSE;
        nameptr += 2;
      }

      if (dig_options[opt].separator != 0) {
        const char *ptr = strchr(nameptr, dig_options[opt].separator);
        if (ptr == NULL) {
          namelen = ares_strlen(nameptr);
        } else {
          namelen = (size_t)(ptr - nameptr);
          value   = ptr + 1;
        }
      } else {
        namelen = ares_strlen(nameptr);
      }

      /* Match name */
      if (dig_options[opt].name != NULL &&
          !ares_streq_max(nameptr, dig_options[opt].name, namelen)) {
        continue;
      }

      if (dig_options[opt].name == NULL) {
        value = nameptr;
      }

      /* We need another argument for the value */
      if (dig_options[opt].type != OPT_TYPE_BOOL &&
          dig_options[opt].prefix != 0 && dig_options[opt].separator == 0) {
        if (arg == argc - 1) {
          snprintf(global_config.error, sizeof(global_config.error),
                   "insufficient arguments for %c%s", dig_options[opt].prefix,
                   dig_options[opt].name);
          return ARES_FALSE;
        }
        arg++;
        value = argv[arg];
      }

      switch (dig_options[opt].type) {
        case OPT_TYPE_BOOL:
          {
            ares_bool_t *b = dig_options[opt].opt;
            if (b == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *b = is_true;
          }
          break;
        case OPT_TYPE_STRING:
          {
            char **str = dig_options[opt].opt;
            if (str == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (*str != NULL) {
              free(*str);
            }
            *str = strdup(value);
            break;
          }
        case OPT_TYPE_SIZE_T:
          {
            size_t *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_U16:
          {
            unsigned short *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = (unsigned short)strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_FUNC:
          if (dig_options[opt].cb == NULL) {
            snprintf(global_config.error, sizeof(global_config.error),
                     "missing callback");
            return ARES_FALSE;
          }
          if (!dig_options[opt].cb(dig_options[opt].prefix,
                                   dig_options[opt].name, is_true, value)) {
            return ARES_FALSE;
          }
          break;
      }
      option_handled = ARES_TRUE;
    }

    if (!option_handled) {
      snprintf(global_config.error, sizeof(global_config.error),
               "unrecognized option %s", argv[arg]);
      return ARES_FALSE;
    }
  }

  return ARES_TRUE;
}